

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_options.c
# Opt level: O0

char * parse_option(char **s,char **m,char **o,char **v)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char *p;
  char *val;
  char *opt;
  char *mod;
  char *end;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  pcVar3 = (char *)*in_RDI;
  local_48 = "1";
  pcVar1 = strchr(pcVar3,0x2c);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    local_30 = pcVar1 + 1;
  }
  sVar2 = strlen(pcVar3);
  if (sVar2 == 0) {
    *in_RDI = local_30;
    *in_RSI = 0;
    *in_RDX = 0;
    *in_RCX = 0;
  }
  else {
    pcVar1 = strchr(pcVar3,0x3a);
    local_40 = pcVar3;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
      local_40 = pcVar1 + 1;
      local_38 = pcVar3;
    }
    pcVar3 = strchr(local_40,0x3d);
    if (pcVar3 == (char *)0x0) {
      if (*local_40 == '!') {
        local_40 = local_40 + 1;
        local_48 = (char *)0x0;
      }
    }
    else {
      *pcVar3 = '\0';
      local_48 = pcVar3 + 1;
    }
    *in_RDI = local_30;
    *in_RSI = local_38;
    *in_RDX = (long)local_40;
    *in_RCX = local_48;
  }
  return local_30;
}

Assistant:

static const char *
parse_option(const char **s, const char **m, const char **o, const char **v)
{
	const char *end, *mod, *opt, *val;
	char *p;

	end = NULL;
	mod = NULL;
	opt = *s;
	val = "1";

	p = strchr(opt, ',');

	if (p != NULL) {
		*p = '\0';
		end = ((const char *)p) + 1;
	}

	if (0 == strlen(opt)) {
		*s = end;
		*m = NULL;
		*o = NULL;
		*v = NULL;
		return end;
	}

	p = strchr(opt, ':');
	if (p != NULL) {
		*p = '\0';
		mod = opt;
		opt = ++p;
	}

	p = strchr(opt, '=');
	if (p != NULL) {
		*p = '\0';
		val = ++p;
	} else if (opt[0] == '!') {
		++opt;
		val = NULL;
	}

	*s = end;
	*m = mod;
	*o = opt;
	*v = val;

	return end;
}